

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::RelativeTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  long lVar1;
  int iVar2;
  EnumDescriptor *pEVar3;
  string *psVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  ulong uVar5;
  string containing_type;
  string type;
  string package;
  _anonymous_namespace_ *local_98;
  ulong local_90;
  FieldDescriptor local_88 [16];
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  _func_void_FieldDescriptor_ptr *local_58 [2];
  undefined1 local_48 [16];
  _anonymous_namespace_ *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_58[0] = FieldDescriptor::TypeOnceInit;
    local_98 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),local_58,(FieldDescriptor **)&local_98);
  }
  iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4);
  if (iVar2 != 8) {
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_58[0] = FieldDescriptor::TypeOnceInit;
      local_98 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),local_58,(FieldDescriptor **)&local_98);
      iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4);
    }
    if (iVar2 != 10) {
      __assert_fail("field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM || field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                    ,0x4bf,
                    "std::string google::protobuf::compiler::js::(anonymous namespace)::RelativeTypeName(const FieldDescriptor *)"
                   );
    }
  }
  lVar1 = **(long **)(*(long *)(this + 0x10) + 8);
  local_58[0] = (_func_void_FieldDescriptor_ptr *)local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,lVar1,(*(long **)(*(long *)(this + 0x10) + 8))[1] + lVar1);
  lVar1 = *(long *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x20);
  local_98 = (_anonymous_namespace_ *)local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,lVar1,
             *(long *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x28) + lVar1);
  std::__cxx11::string::append((char *)&local_98);
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),&local_30,(FieldDescriptor **)&local_38);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) == 8) {
    pEVar3 = FieldDescriptor::enum_type((FieldDescriptor *)this);
  }
  else {
    pEVar3 = (EnumDescriptor *)FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  lVar1 = *(long *)(*(long *)(pEVar3 + 8) + 0x20);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,lVar1,*(long *)(*(long *)(pEVar3 + 8) + 0x28) + lVar1);
  if (local_70 < local_90) {
    local_90 = local_70;
  }
  if (local_90 != 0) {
    uVar5 = 0;
    do {
      if (*(FieldDescriptor *)(local_78 + uVar5) != *(FieldDescriptor *)(local_98 + uVar5)) break;
      uVar5 = uVar5 + 1;
    } while (local_90 != uVar5);
  }
  psVar4 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_78);
  if (local_78 != local_68) {
    operator_delete(local_78);
    psVar4 = extraout_RAX;
  }
  if (local_98 != (_anonymous_namespace_ *)local_88) {
    operator_delete(local_98);
    psVar4 = extraout_RAX_00;
  }
  if (local_58[0] != (_func_void_FieldDescriptor_ptr *)local_48) {
    operator_delete(local_58[0]);
    psVar4 = extraout_RAX_01;
  }
  return psVar4;
}

Assistant:

std::string RelativeTypeName(const FieldDescriptor* field) {
  assert(field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM ||
         field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  // For a field with an enum or message type, compute a name relative to the
  // path name of the message type containing this field.
  std::string package = field->file()->package();
  std::string containing_type = field->containing_type()->full_name() + ".";
  std::string type = (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM)
                         ? field->enum_type()->full_name()
                         : field->message_type()->full_name();

  // |prefix| is advanced as we find separators '.' past the common package
  // prefix that yield common prefixes in the containing type's name and this
  // type's name.
  int prefix = 0;
  for (int i = 0; i < type.size() && i < containing_type.size(); i++) {
    if (type[i] != containing_type[i]) {
      break;
    }
    if (type[i] == '.' && i >= package.size()) {
      prefix = i + 1;
    }
  }

  return type.substr(prefix);
}